

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_machoread.c
# Opt level: O1

int macho_load_section(void *obj,Dwarf_Unsigned section_index,Dwarf_Small **return_data,int *error)

{
  Dwarf_Small *pDVar1;
  size_t __size;
  long lVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  char *buf;
  long lVar6;
  
  if (section_index == 0) {
    return -1;
  }
  if (*(ulong *)((long)obj + 200) <= section_index) {
    return -1;
  }
  pDVar1 = *(Dwarf_Small **)(*(long *)((long)obj + 0xd0) + 0x98 + section_index * 0xa0);
  if (pDVar1 == (Dwarf_Small *)0x0) {
    lVar6 = *(long *)((long)obj + 0xd0) + section_index * 0xa0;
    __size = *(size_t *)(lVar6 + 0x40);
    if (__size == 0) {
      return -1;
    }
    lVar2 = *(long *)(lVar6 + 0x48);
    uVar3 = *(ulong *)((long)obj + 0x18);
    if (uVar3 < lVar2 + __size) {
      *error = 0x1a7;
    }
    else {
      lVar4 = *(long *)((long)obj + 0x30);
      buf = (char *)malloc(__size);
      *(char **)(lVar6 + 0x98) = buf;
      if (buf != (char *)0x0) {
        iVar5 = _dwarf_object_read_random
                          (*(int *)((long)obj + 0x10),buf,lVar2 + lVar4,__size,uVar3 + lVar4,error);
        if (iVar5 != 0) {
          free(*(Dwarf_Small **)(lVar6 + 0x98));
          *(undefined8 *)(lVar6 + 0x98) = 0;
          return iVar5;
        }
        *return_data = *(Dwarf_Small **)(lVar6 + 0x98);
        goto LAB_001bbad2;
      }
      *error = 0x3e;
    }
    iVar5 = 1;
  }
  else {
    *return_data = pDVar1;
LAB_001bbad2:
    iVar5 = 0;
  }
  return iVar5;
}

Assistant:

static int
macho_load_section (void *obj, Dwarf_Unsigned section_index,
    Dwarf_Small **return_data, int *error)
{
    dwarf_macho_object_access_internals_t *macho =
        (dwarf_macho_object_access_internals_t*)(obj);

    if (0 < section_index &&
        section_index < macho->mo_dwarf_sectioncount) {
        int res = 0;
        Dwarf_Unsigned inner = macho->mo_inner_offset;

        struct generic_macho_section *sp =
            macho->mo_dwarf_sections + section_index;
        if (sp->loaded_data) {
            *return_data = sp->loaded_data;
            return DW_DLV_OK;
        }
        if (!sp->size) {
            return DW_DLV_NO_ENTRY;
        }
        if ((sp->size + sp->offset) >
            macho->mo_filesize) {
            *error = DW_DLE_FILE_TOO_SMALL;
            return DW_DLV_ERROR;
        }

        sp->loaded_data = malloc((size_t)sp->size);
        if (!sp->loaded_data) {
            *error = DW_DLE_ALLOC_FAIL;
            return DW_DLV_ERROR;
        }
        res = RRMOA(macho->mo_fd,
            sp->loaded_data, (inner+sp->offset),
            sp->size,
            (inner+macho->mo_filesize), error);
        if (res != DW_DLV_OK) {
            free(sp->loaded_data);
            sp->loaded_data = 0;
            return res;
        }
        *return_data = sp->loaded_data;
        return DW_DLV_OK;
    }
    return DW_DLV_NO_ENTRY;
}